

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseArrayValue
          (Status *__return_storage_ptr__,JsonStreamParser *this,TokenType type)

{
  bool bVar1;
  StringPiece local_70;
  undefined1 local_60 [40];
  StringPiece local_38;
  
  if (type == END_ARRAY) {
    (*this->ow_->_vptr_ObjectWriter[5])();
    Advance(this);
    Status::Status(__return_storage_ptr__);
  }
  else if (type == UNKNOWN) {
    StringPiece::StringPiece(&local_70,"Expected a value or ] within an array.");
    ReportUnknown(__return_storage_ptr__,this,local_70);
  }
  else {
    local_60._0_4_ = ARRAY_MID;
    std::
    deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
    ::emplace_back<google::protobuf::util::converter::JsonStreamParser::ParseType>
              (&(this->stack_).c,(ParseType *)local_60);
    ParseValue(__return_storage_ptr__,this,type);
    StringPiece::StringPiece(&local_38,"");
    Status::Status((Status *)local_60,CANCELLED,local_38);
    bVar1 = Status::operator==(__return_storage_ptr__,(Status *)local_60);
    std::__cxx11::string::~string((string *)(local_60 + 8));
    if (bVar1) {
      std::
      deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
      ::pop_back(&(this->stack_).c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ParseArrayValue(TokenType type) {
  if (type == UNKNOWN) {
    return ReportUnknown("Expected a value or ] within an array.");
  }

  if (type == END_ARRAY) {
    ow_->EndList();
    Advance();
    return util::Status();
  }

  // The ParseValue call may push something onto the stack so we need to make
  // sure an ARRAY_MID is after it, so we push it on now. Also, the parsing of
  // empty-null array value is relying on this ARRAY_MID token.
  stack_.push(ARRAY_MID);
  util::Status result = ParseValue(type);
  if (result == util::Status(util::error::CANCELLED, "")) {
    // If we were cancelled, pop back off the ARRAY_MID so we don't try to
    // push it on again when we try over.
    stack_.pop();
  }
  return result;
}